

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_objref.cpp
# Opt level: O0

bool __thiscall ON_ObjRef_IRefID::Read(ON_ObjRef_IRefID *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  bool local_29;
  int local_28;
  int iStack_24;
  bool rc;
  int minor_version;
  int major_version;
  ON_BinaryArchive *archive_local;
  ON_ObjRef_IRefID *this_local;
  
  _minor_version = archive;
  archive_local = (ON_BinaryArchive *)this;
  Default(this);
  iStack_24 = 0;
  local_28 = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk
                    (_minor_version,0x40008000,&stack0xffffffffffffffdc,&local_28);
  if (bVar1) {
    local_29 = iStack_24 == 1;
    if ((((local_29) &&
         (local_29 = ON_BinaryArchive::ReadUuid(_minor_version,&this->m_iref_uuid), local_29)) &&
        (local_29 = ON_BinaryArchive::ReadXform(_minor_version,&this->m_iref_xform), local_29)) &&
       (((local_29 = ON_BinaryArchive::ReadUuid(_minor_version,&this->m_idef_uuid), local_29 &&
         (local_29 = ON_BinaryArchive::ReadInt(_minor_version,&this->m_idef_geometry_index),
         local_29)) &&
        ((0 < local_28 &&
         (local_29 = ON_BinaryArchive::ReadComponentIndex(_minor_version,&this->m_component_index),
         local_29)))))) {
      local_29 = ON_ObjRefEvaluationParameter::Read(&this->m_evp,_minor_version);
    }
    bVar1 = ON_BinaryArchive::EndRead3dmChunk(_minor_version);
    if (!bVar1) {
      local_29 = false;
    }
    this_local._7_1_ = local_29;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_ObjRef_IRefID::Read( ON_BinaryArchive& archive )
{
  Default();

  int major_version = 0;
  int minor_version = 0;
  bool rc = archive.BeginRead3dmChunk( 
                          TCODE_ANONYMOUS_CHUNK, 
                          &major_version, 
                          &minor_version );
  if ( !rc )
    return false;

  for(;;)
  {
    rc = (1 == major_version);
    if (!rc) break;

    rc = archive.ReadUuid(m_iref_uuid);
    if (!rc) break;

    rc = archive.ReadXform(m_iref_xform);
    if (!rc) break;

    rc = archive.ReadUuid(m_idef_uuid);
    if (!rc) break;

    rc = archive.ReadInt(&m_idef_geometry_index);
    if (!rc) break;

    if ( minor_version >= 1 )
    {
      // 13 July 2006 - 1.1 - added m_component_index and m_evp
      rc = archive.ReadComponentIndex(m_component_index);
      if (!rc) break;

      rc = m_evp.Read(archive);
      if (!rc) break;
    }

    break;
  }

  if ( !archive.EndRead3dmChunk() )
    rc = false;
  return rc;
}